

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O1

int ReadF0(char *filename,double *temporal_positions,double *f0)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  size_t __n;
  double frame_period;
  int number_of_frames;
  char data_check [5];
  double local_40;
  int local_34;
  undefined1 local_2d [5];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File cannot be opened.");
  }
  else {
    iVar1 = anon_unknown.dwarf_c077::CheckHeader((FILE *)__stream,"F0  ");
    if (iVar1 != 0) {
      fread(local_2d,1,4,__stream);
      fread(&local_34,4,1,__stream);
      fread(local_2d,1,4,__stream);
      fread(&local_40,8,1,__stream);
      __n = (size_t)local_34;
      fread(f0,8,__n,__stream);
      fclose(__stream);
      if (0 < (long)__n) {
        sVar2 = 0;
        do {
          temporal_positions[sVar2] = ((double)(int)sVar2 / 1000.0) * local_40;
          sVar2 = sVar2 + 1;
        } while (__n != sVar2);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int ReadF0(const char *filename, double *temporal_positions, double *f0) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  // Header
  if (CheckHeader(fp, "F0  ") == 0) return 0;

  // Parameters
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "NOF "
  int number_of_frames;
  fread(&number_of_frames, 4, 1, fp);

  fread(data_check, 1, 4, fp);  // "FP  "
  double frame_period;
  fread(&frame_period, 8, 1, fp);

  // Data
  fread(f0, 8, number_of_frames, fp);

  fclose(fp);
  for (int i = 0; i < number_of_frames; ++i)
    temporal_positions[i] = i / 1000.0 * frame_period;
  return 1;
}